

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

int qMetaTypeTypeInternal(QByteArrayView name)

{
  int iVar1;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffffc8;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArrayView::data(&local_18);
  QByteArrayView::size(&local_18);
  iVar1 = qMetaTypeTypeImpl<((anonymous_namespace)::NormalizeTypeMode)0>
                    (in_stack_ffffffffffffffc8,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

Q_CORE_EXPORT int qMetaTypeTypeInternal(QByteArrayView name)
{
    return qMetaTypeTypeImpl<DontNormalizeType>(name.data(), name.size());
}